

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<TPZFlopCounter>::SolveSOR
          (TPZMatrix<TPZFlopCounter> *this,int64_t *numiterations,TPZFMatrix<TPZFlopCounter> *F,
          TPZFMatrix<TPZFlopCounter> *result,TPZFMatrix<TPZFlopCounter> *residual,
          TPZFMatrix<TPZFlopCounter> *param_5,REAL overrelax,REAL *tol,int FromCurrent,int direction
          )

{
  long lVar1;
  int iVar2;
  int extraout_var;
  TPZFlopCounter *pTVar4;
  long lVar5;
  long lVar6;
  long row;
  int64_t ic;
  long col;
  long lVar7;
  int64_t j;
  long row_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar8;
  double extraout_XMM0_Qa_01;
  undefined1 auVar9 [16];
  double __x;
  REAL local_a8;
  long lVar3;
  
  if (residual != F) {
    auVar9._8_4_ = 0xffffffff;
    auVar9._0_8_ = 0xffffffffffffffff;
    auVar9._12_4_ = 0xffffffff;
    TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
    TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] - auVar9._8_8_;
    if (residual == (TPZFMatrix<TPZFlopCounter> *)0x0) {
      local_a8 = *tol + *tol + 1.0;
    }
    else {
      local_a8 = (REAL)Norm(residual);
    }
    if (FromCurrent == 0) {
      (*(result->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xf])();
    }
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    lVar3 = CONCAT44(extraout_var,iVar2);
    lVar5 = (F->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fCol;
    lVar7 = 0;
    lVar6 = lVar3 + -1;
    lVar1 = -1;
    if (direction != -1) {
      lVar6 = lVar7;
      lVar1 = lVar3;
    }
    if (lVar3 == 0 || extraout_var < 0) {
      lVar3 = lVar7;
    }
    if (lVar5 < 1) {
      lVar5 = lVar7;
    }
    while ((lVar7 < *numiterations && (ABS(*tol) < ABS(local_a8)))) {
      __x = 0.0;
      for (col = 0; row = lVar6, col != lVar5; col = col + 1) {
        for (; row != lVar1; row = row + (ulong)(direction != -1) * 2 + -1) {
          (*(F->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(F,row,col);
          dVar8 = extraout_XMM0_Qa;
          for (row_00 = 0; lVar3 != row_00; row_00 = row_00 + 1) {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,row,row_00);
            pTVar4 = TPZFMatrix<TPZFlopCounter>::operator()(result,row_00,col);
            dVar8 = dVar8 - extraout_XMM0_Qa_00 * pTVar4->fVal;
            TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
            TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
          }
          __x = __x + dVar8 * dVar8;
          TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
          TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 2;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,row,row);
          TPZFlopCounter::gCount.fCount[2] = TPZFlopCounter::gCount.fCount[2] + 1;
          pTVar4 = TPZFMatrix<TPZFlopCounter>::operator()(result,row,col);
          pTVar4->fVal = (dVar8 * overrelax) / extraout_XMM0_Qa_01 + pTVar4->fVal;
          TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
        }
      }
      if (__x < 0.0) {
        local_a8 = sqrt(__x);
      }
      else {
        local_a8 = SQRT(__x);
      }
      TPZFlopCounter::gCount.fCount[3] = TPZFlopCounter::gCount.fCount[3] + 1;
      lVar7 = lVar7 + 1;
    }
    if (residual != (TPZFMatrix<TPZFlopCounter> *)0x0) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F);
    }
    *numiterations = lVar7;
    *tol = ABS(local_a8);
    return;
  }
  std::operator<<((ostream *)&std::cout,
                  "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}